

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VCVT_f64_f16(DisasContext_conflict1 *s,arg_VCVT_f64_f16 *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ret;
  uint uVar2;
  _Bool _Var3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar2 = s->isar->mvfr0;
  if ((((uVar2 & 0xf00) == 0) || ((s->isar->mvfr1 & 0xe000000) == 0)) ||
     ((s_00 = s->uc->tcg_ctx, (uVar2 & 0xe) == 0 && ((a->vd & 0x10) != 0)))) {
    _Var3 = false;
  }
  else {
    _Var1 = full_vfp_access_check(s,false);
    _Var3 = true;
    if (_Var1) {
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ts_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                          0x2e6c);
      tcg_gen_extract_i32_aarch64
                (s_00,(TCGv_i32)((long)ts_00 - (long)s_00),(TCGv_i32)((long)ts_00 - (long)s_00),0x1a
                 ,1);
      ts_01 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      uVar2 = a->vm << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld16u_i32,(TCGArg)ts_01,(TCGArg)(s_00->cpu_env + (long)s_00)
                          ,((ulong)(uVar2 & 4) | (ulong)(uVar2 & 8) | (ulong)((uint)a->vm >> 2) << 8
                           ) + (ulong)(a->t != 0) * 2 + 0xc10);
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      local_48 = ts_01;
      local_40 = ts;
      local_38 = ts_00;
      tcg_gen_callN_aarch64(s_00,helper_vfp_fcvt_f16_to_f64_aarch64,ret,3,&local_48);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ts_00);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ts_01);
      tcg_temp_free_internal_aarch64(s_00,ret);
    }
  }
  return _Var3;
}

Assistant:

static bool trans_VCVT_f64_f16(DisasContext *s, arg_VCVT_f64_f16 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i32 ahp_mode;
    TCGv_i32 tmp;
    TCGv_i64 vd;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fp16_dpconv, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd  & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    ahp_mode = get_ahp_flag(tcg_ctx);
    tmp = tcg_temp_new_i32(tcg_ctx);
    /* The T bit tells us if we want the low or high 16 bits of Vm */
    tcg_gen_ld16u_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, vfp_f16_offset(a->vm, a->t));
    vd = tcg_temp_new_i64(tcg_ctx);
    gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx, vd, tmp, fpst, ahp_mode);
    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, ahp_mode);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, vd);
    return true;
}